

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O3

void compactor_get_virtual_filename(char *filename,char *virtual_filename)

{
  ulong uVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  
  sVar3 = strlen(filename);
  uVar4 = sVar3 & 0xffffffff;
  do {
    if ((int)uVar4 < 1) goto LAB_0011e317;
    uVar1 = uVar4 - 1;
    lVar2 = uVar4 - 1;
    uVar4 = uVar1;
  } while (filename[lVar2] != '.');
  if (uVar1 != 0) {
    strncpy(virtual_filename,filename,uVar1 & 0xffffffff);
    virtual_filename[uVar1 & 0xffffffff] = '\0';
    return;
  }
LAB_0011e317:
  strcpy(virtual_filename,filename);
  return;
}

Assistant:

void compactor_get_virtual_filename(const char *filename,
                                    char *virtual_filename)
{
    int prefix_len = _compactor_prefix_len((char*)filename) - 1;
    if (prefix_len > 0) {
        strncpy(virtual_filename, filename, prefix_len);
        virtual_filename[prefix_len] = 0;
    } else {
        strcpy(virtual_filename, filename);
    }
}